

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O1

void __thiscall xLearn::Trainer::show_average_metric(Trainer *this)

{
  pointer pMVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  long lVar4;
  long lVar5;
  undefined1 in_XMM2 [16];
  Modifier reset;
  Modifier green;
  Modifier local_70;
  float local_6c;
  float local_68;
  Modifier local_64;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pMVar1 = (this->metric_info_).
           super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->metric_info_).
                super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar1;
  if (lVar4 == 0) {
    local_68 = 0.0;
    local_6c = 0.0;
  }
  else {
    lVar4 = lVar4 >> 3;
    local_6c = 0.0;
    lVar5 = 0;
    local_68 = 0.0;
    do {
      if (this->metric_ != (Metric *)0x0) {
        local_6c = local_6c + pMVar1[lVar5].metric_val;
      }
      local_68 = local_68 + pMVar1[lVar5].loss_val;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  (*this->loss_->_vptr_Loss[8])(local_40);
  auVar2 = vcvtusi2ss_avx512f(in_XMM2,(long)(this->metric_info_).
                                            super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->metric_info_).
                                            super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  StringPrintf_abi_cxx11_
            (&local_60,"Average %s: %.6f",(double)(local_68 / auVar2._0_4_),local_40[0]);
  local_64.code = FG_GREEN;
  local_70.code = RESET;
  poVar3 = Color::operator<<((ostream *)&std::cout,&local_64);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[------------] ",0xf);
  poVar3 = Color::operator<<(poVar3,&local_70);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (this->metric_ != (Metric *)0x0) {
    (*this->metric_->_vptr_Metric[5])(local_40);
    auVar2 = vcvtusi2ss_avx512f(in_XMM2,(long)(this->metric_info_).
                                              super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->metric_info_).
                                              super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3);
    StringPrintf_abi_cxx11_
              (&local_60,"Average %s: %.6f",(double)(local_6c / auVar2._0_4_),local_40[0]);
    local_64.code = FG_GREEN;
    local_70.code = RESET;
    poVar3 = Color::operator<<((ostream *)&std::cout,&local_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[------------] ",0xf);
    poVar3 = Color::operator<<(poVar3,&local_70);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return;
}

Assistant:

void Trainer::show_average_metric() {
  real_t loss = 0;
  real_t metric = 0;
  for (size_t i = 0; i < metric_info_.size(); ++i) {
    loss += metric_info_[i].loss_val;
    if (metric_ != nullptr) {
      metric += metric_info_[i].metric_val;
    }
  }
  Color::print_info(
    StringPrintf("Average %s: %.6f", 
    loss_->loss_type().c_str(), 
    loss / metric_info_.size())
  );
  if (metric_ != nullptr) {
    Color::print_info(
      StringPrintf("Average %s: %.6f", 
      metric_->metric_type().c_str(),
       metric / metric_info_.size())
    );
  }
}